

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O2

void rw::xbox::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  ushort uVar2;
  uint32 uVar3;
  Geometry *this;
  InstanceDataHeader *pIVar4;
  long lVar5;
  uint32 *puVar6;
  int32 extraout_EDX;
  MeshHeader *pMVar7;
  uint uVar8;
  uint32 uVar9;
  int32 iVar10;
  ulong uVar11;
  undefined8 *puVar12;
  MeshHeader *pMVar13;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) == 0) {
    return;
  }
  pMVar13 = this->meshHeader;
  pIVar4 = this->instData;
  lVar5 = *(long *)(pIVar4 + 10);
  pMVar13->totalIndices = 0;
  uVar2 = *(ushort *)((long)&pIVar4[2].platform + 2);
  puVar6 = (uint32 *)(lVar5 + 8);
  uVar9 = 0;
  pMVar7 = pMVar13;
  for (uVar11 = 0; pMVar7 = (MeshHeader *)&pMVar7[1].totalIndices, uVar11 < uVar2;
      uVar11 = uVar11 + 1) {
    uVar3 = *puVar6;
    *(uint32 *)pMVar7 = uVar3;
    uVar9 = uVar9 + uVar3;
    pMVar13->totalIndices = uVar9;
    puVar6 = puVar6 + 10;
  }
  pMVar13->flags = (uint)(pIVar4[3].platform == 6);
  uVar9 = MeshHeader::guessNumTriangles(pMVar13);
  this->numTriangles = uVar9;
  Geometry::allocateData(this);
  Geometry::allocateMeshes(this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
  pMVar13 = this->meshHeader + 1;
  puVar12 = (undefined8 *)(lVar5 + 0x10);
  for (uVar8 = 0; uVar8 < *(ushort *)((long)&pIVar4[2].platform + 2); uVar8 = uVar8 + 1) {
    memcpy(*(void **)pMVar13,(void *)*puVar12,(long)*(int *)(puVar12 + -1) * 2);
    pMVar13 = (MeshHeader *)&pMVar13[1].totalIndices;
    puVar12 = puVar12 + 5;
  }
  (**(code **)&rwpipe[1].super_Pipeline.platform)(this);
  iVar10 = 0;
  Geometry::generateTriangles(this,(int8 *)0x0);
  pbVar1 = (byte *)((long)&this->flags + 3);
  *pbVar1 = *pbVar1 & 0xfe;
  destroyNativeData(this,iVar10,extraout_EDX);
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_XBOX);

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	InstanceData *inst = header->begin;
	Mesh *mesh = geo->meshHeader->getMeshes();
	// For some reason numIndices in mesh and instance data are not always equal
	// And primitive isn't always correct either. Maybe some internal conversion...
	geo->meshHeader->totalIndices = 0;
	for(uint32 i = 0; i < header->numMeshes; i++){
		mesh[i].numIndices = inst[i].numIndices;
		geo->meshHeader->totalIndices += mesh[i].numIndices;
	}
	geo->meshHeader->flags = header->primType == D3DPT_TRIANGLESTRIP ?
		MeshHeader::TRISTRIP : 0;

	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);

	mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		uint16 *indices = (uint16*)inst->indexBuffer;
		memcpy(mesh->indices, indices, inst->numIndices*2);
		mesh++;
		inst++;
	}

	pipe->uninstanceCB(geo, header);
	geo->generateTriangles();
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}